

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O3

int SUNNonlinSolSolve_FixedPoint
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,sunrealtype tol,
              int callSetup,void *mem)

{
  long *plVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 *__s;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  double *pdVar11;
  long lVar12;
  undefined8 uVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  undefined1 (*pauVar18) [16];
  long lVar19;
  void *pvVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  double *pdVar26;
  undefined1 (*pauVar27) [16];
  ulong uVar28;
  long lVar29;
  int iVar30;
  ulong uVar31;
  double *pdVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  double dVar38;
  undefined1 auVar39 [16];
  int iVar40;
  ulong uVar41;
  int iVar44;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar47;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  
  pvVar20 = NLS->content;
  uVar3 = *(undefined8 *)((long)pvVar20 + 0x68);
  uVar4 = *(undefined8 *)((long)pvVar20 + 0x70);
  uVar5 = *(undefined8 *)((long)pvVar20 + 0x88);
  *(undefined4 *)((long)pvVar20 + 0x90) = 0;
  *(undefined8 *)((long)pvVar20 + 0x98) = 0;
  *(undefined8 *)((long)pvVar20 + 0xa0) = 0;
  if (*(int *)((long)pvVar20 + 0x94) < 1) {
    lVar23 = 1;
  }
  else {
    do {
      N_VScale(ycor,uVar3);
      iVar15 = (**NLS->content)(ycor,uVar4,mem);
      if (iVar15 != 0) {
        return iVar15;
      }
      pvVar20 = NLS->content;
      uVar17 = *(uint *)((long)pvVar20 + 0x10);
      uVar31 = (ulong)uVar17;
      if (uVar31 == 0) {
        N_VScale(0x3ff0000000000000,uVar4,ycor);
      }
      else {
        uVar2 = *(uint *)((long)pvVar20 + 0x90);
        __s = *(undefined4 **)((long)pvVar20 + 0x18);
        uVar6 = *(undefined8 *)((long)pvVar20 + 0x80);
        uVar7 = *(undefined8 *)((long)pvVar20 + 0x78);
        lVar23 = *(long *)((long)pvVar20 + 0x48);
        lVar8 = *(long *)((long)pvVar20 + 0x50);
        lVar19 = *(long *)((long)pvVar20 + 0x58);
        puVar9 = *(undefined8 **)((long)pvVar20 + 0x40);
        puVar10 = *(undefined8 **)((long)pvVar20 + 0x60);
        pdVar11 = *(double **)((long)pvVar20 + 0x30);
        lVar12 = *(long *)((long)pvVar20 + 0x38);
        uVar13 = *(undefined8 *)((long)pvVar20 + 0x88);
        iVar15 = *(int *)((long)pvVar20 + 0x20);
        dVar34 = *(double *)((long)pvVar20 + 0x28);
        if (0 < (int)uVar17) {
          memset(__s,0,uVar31 * 4);
        }
        uVar16 = uVar2 - 1;
        uVar25 = (long)(int)uVar16 % (long)(int)uVar17 & 0xffffffff;
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,uVar4,uVar3,uVar13);
        iVar30 = (int)((long)(int)uVar16 % (long)(int)uVar17);
        if (0 < (int)uVar2) {
          N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,uVar4,uVar6,
                       *(undefined8 *)(lVar8 + (long)iVar30 * 8));
          N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,uVar13,uVar7,
                       *(undefined8 *)(lVar23 + (long)iVar30 * 8));
        }
        N_VScale(0x3ff0000000000000,uVar4,uVar6);
        N_VScale(0x3ff0000000000000,uVar13,uVar7);
        if (uVar2 == 1) {
          uVar6 = *(undefined8 *)(lVar23 + uVar25 * 8);
          dVar38 = (double)N_VDotProd(uVar6,uVar6);
          dVar33 = 0.0;
          if (0.0 < dVar38) {
            if (dVar38 < 0.0) {
              dVar33 = sqrt(dVar38);
            }
            else {
              dVar33 = SQRT(dVar38);
            }
          }
          *pdVar11 = dVar33;
          N_VScale(1.0 / dVar33,*(undefined8 *)(lVar23 + uVar25 * 8),
                   *(undefined8 *)(lVar19 + uVar25 * 8));
          *__s = 0;
        }
        else {
          if (uVar2 == 0) {
            N_VScale(0x3ff0000000000000,uVar4,ycor);
            goto LAB_00101d52;
          }
          if ((int)uVar17 < (int)uVar2) {
            uVar16 = uVar17 - 1;
            if ((int)uVar17 < 2) {
              N_VScale(0x3ff0000000000000,*(undefined8 *)(lVar23 + (long)iVar30 * 8),ycor);
            }
            else {
              uVar28 = (ulong)uVar16;
              pauVar27 = (undefined1 (*) [16])(pdVar11 + uVar31 * 2);
              uVar24 = 2;
              uVar25 = 0;
              do {
                uVar41 = uVar25 + 1;
                uVar21 = (ulong)(uVar17 * (int)uVar41);
                auVar35 = *(undefined1 (*) [16])(pdVar11 + uVar25 + uVar21);
                dVar38 = auVar35._0_8_ * auVar35._0_8_ + auVar35._8_8_ * auVar35._8_8_;
                auVar39._0_8_ = (double)(-(ulong)(0.0 < dVar38) & (ulong)SQRT(dVar38));
                pdVar11[uVar25 + uVar21] = auVar39._0_8_;
                auVar39._8_8_ = auVar39._0_8_;
                auVar35 = divpd(auVar35,auVar39);
                pdVar11[uVar25 + uVar21 + 1] = 0.0;
                pauVar18 = pauVar27;
                uVar21 = uVar31;
                if (uVar25 + 2 < uVar31) {
                  do {
                    auVar42._8_8_ =
                         *(double *)*pauVar18 * -auVar35._8_8_ +
                         *(double *)((long)*pauVar18 + 8) * auVar35._0_8_;
                    auVar42._0_8_ =
                         *(double *)*pauVar18 * auVar35._0_8_ +
                         *(double *)((long)*pauVar18 + 8) * auVar35._8_8_;
                    *pauVar18 = auVar42;
                    uVar21 = uVar21 - 1;
                    pauVar18 = (undefined1 (*) [16])((long)*pauVar18 + uVar31 * 8);
                  } while (uVar24 != uVar21);
                }
                N_VLinearSum(*(undefined8 *)(lVar19 + uVar25 * 8),
                             *(undefined8 *)(lVar19 + uVar41 * 8),ycor);
                N_VLinearSum(*(undefined8 *)(lVar19 + uVar25 * 8),
                             *(undefined8 *)(lVar19 + uVar41 * 8));
                N_VScale(0x3ff0000000000000,ycor,*(undefined8 *)(lVar19 + uVar25 * 8));
                uVar24 = uVar24 + 1;
                pauVar27 = (undefined1 (*) [16])((long)*pauVar27 + (uVar31 + 1) * 8);
                uVar25 = uVar41;
              } while (uVar41 != uVar28);
              uVar24 = 1;
              pdVar26 = pdVar11;
              uVar25 = uVar28;
              pdVar32 = pdVar11;
              do {
                do {
                  *pdVar26 = pdVar26[uVar31];
                  uVar25 = uVar25 - 1;
                  pdVar26 = pdVar26 + 1;
                } while (uVar25 != 0);
                uVar24 = uVar24 + 1;
                pdVar26 = pdVar32 + uVar31;
                uVar25 = uVar28;
                pdVar32 = pdVar26;
              } while (uVar24 != uVar31);
              N_VScale(0x3ff0000000000000,*(undefined8 *)(lVar23 + (long)iVar30 * 8),ycor);
              uVar25 = 0;
              do {
                dVar38 = (double)N_VDotProd(*(undefined8 *)(lVar19 + uVar25 * 8),ycor);
                pdVar11[uVar16 * uVar17 + uVar25] = dVar38;
                N_VLinearSum(0x3ff0000000000000,-dVar38,ycor,*(undefined8 *)(lVar19 + uVar25 * 8),
                             ycor);
                uVar25 = uVar25 + 1;
              } while (uVar28 != uVar25);
            }
            dVar38 = (double)N_VDotProd(ycor,ycor);
            dVar33 = 0.0;
            if (0.0 < dVar38) {
              if (dVar38 < 0.0) {
                dVar33 = sqrt(dVar38);
              }
              else {
                dVar33 = SQRT(dVar38);
              }
            }
            pdVar11[(long)(int)(uVar17 * uVar17) + -1] = dVar33;
            N_VScale(1.0 / dVar33,ycor);
            auVar42 = _DAT_00103050;
            auVar39 = _DAT_00103040;
            auVar35 = _DAT_00103030;
            if ((int)(iVar30 + 1U) < (int)uVar17) {
              uVar25 = (ulong)(uVar16 - iVar30);
              lVar22 = uVar25 - 1;
              auVar36._8_4_ = (int)lVar22;
              auVar36._0_8_ = lVar22;
              auVar36._12_4_ = (int)((ulong)lVar22 >> 0x20);
              uVar24 = 0;
              auVar46 = _DAT_00103040;
              auVar43 = _DAT_00103030;
              do {
                auVar45 = auVar36 ^ auVar42;
                auVar48 = auVar46 ^ auVar42;
                iVar40 = auVar45._4_4_;
                iVar37 = (int)uVar24;
                if ((bool)(~(iVar40 < auVar48._4_4_ ||
                            auVar45._0_4_ < auVar48._0_4_ && auVar48._4_4_ == iVar40) & 1)) {
                  __s[uVar24] = iVar30 + iVar37 + 1;
                }
                if (auVar48._12_4_ <= auVar45._12_4_ &&
                    (auVar48._8_4_ <= auVar45._8_4_ || auVar48._12_4_ != auVar45._12_4_)) {
                  __s[uVar24 + 1] = iVar30 + iVar37 + 2;
                }
                iVar44 = SUB164(auVar43 ^ auVar42,4);
                if (iVar44 <= iVar40 &&
                    (iVar44 != iVar40 || SUB164(auVar43 ^ auVar42,0) <= auVar45._0_4_)) {
                  __s[uVar24 + 2] = iVar30 + iVar37 + 3;
                  __s[uVar24 + 3] = iVar30 + iVar37 + 4;
                }
                uVar24 = uVar24 + 4;
                lVar22 = auVar46._8_8_;
                auVar46._0_8_ = auVar46._0_8_ + 4;
                auVar46._8_8_ = lVar22 + 4;
                lVar22 = auVar43._8_8_;
                auVar43._0_8_ = auVar43._0_8_ + 4;
                auVar43._8_8_ = lVar22 + 4;
              } while ((uVar25 + 3 & 0xfffffffffffffffc) != uVar24);
            }
            else {
              uVar25 = 0;
            }
            if (-1 < iVar30) {
              lVar22 = (ulong)(iVar30 + 1U) - 1;
              auVar45._8_4_ = (int)lVar22;
              auVar45._0_8_ = lVar22;
              auVar45._12_4_ = (int)((ulong)lVar22 >> 0x20);
              uVar24 = 0;
              do {
                iVar37 = (int)uVar24;
                auVar48._8_4_ = iVar37;
                auVar48._0_8_ = uVar24;
                auVar48._12_4_ = (int)(uVar24 >> 0x20);
                auVar46 = (auVar48 | auVar39) ^ auVar42;
                iVar40 = SUB164(auVar45 ^ auVar42,0);
                bVar14 = iVar40 < auVar46._0_4_;
                iVar44 = SUB164(auVar45 ^ auVar42,4);
                iVar47 = auVar46._4_4_;
                if ((bool)(~(iVar44 < iVar47 || iVar47 == iVar44 && bVar14) & 1)) {
                  __s[uVar25 + uVar24] = iVar37;
                }
                if (iVar44 >= iVar47 && (iVar47 != iVar44 || !bVar14)) {
                  __s[uVar25 + uVar24 + 1] = iVar37 + 1;
                }
                auVar46 = (auVar48 | auVar35) ^ auVar42;
                iVar47 = auVar46._4_4_;
                if (iVar47 <= iVar44 && (iVar47 != iVar44 || auVar46._0_4_ <= iVar40)) {
                  __s[uVar25 + uVar24 + 2] = iVar37 + 2;
                  __s[uVar25 + uVar24 + 3] = iVar37 + 3;
                }
                uVar24 = uVar24 + 4;
              } while ((iVar30 + 4U & 0xfffffffc) != uVar24);
            }
          }
          else {
            N_VScale(0x3ff0000000000000,*(undefined8 *)(lVar23 + (long)iVar30 * 8),ycor);
            if (1 < (int)uVar2) {
              uVar25 = 0;
              do {
                __s[uVar25] = (int)uVar25;
                dVar38 = (double)N_VDotProd(*(undefined8 *)(lVar19 + uVar25 * 8),ycor);
                pdVar11[(long)(int)(uVar16 * uVar17) + uVar25] = dVar38;
                N_VLinearSum(0x3ff0000000000000,-dVar38,ycor,*(undefined8 *)(lVar19 + uVar25 * 8),
                             ycor);
                uVar25 = uVar25 + 1;
              } while (uVar16 != uVar25);
            }
            dVar38 = (double)N_VDotProd(ycor,ycor);
            lVar22 = (long)(int)(uVar16 * uVar17 + uVar2);
            dVar33 = 0.0;
            if (dVar38 <= 0.0) {
              pdVar11[lVar22 + -1] = 0.0;
            }
            else {
              if (dVar38 < 0.0) {
                dVar38 = sqrt(dVar38);
              }
              else {
                dVar38 = SQRT(dVar38);
              }
              pdVar11[lVar22 + -1] = dVar38;
              dVar33 = 0.0;
              if ((dVar38 != 0.0) || (NAN(dVar38))) {
                dVar33 = 1.0 / dVar38;
              }
            }
            N_VScale(dVar33,ycor,*(undefined8 *)(lVar19 + (long)iVar30 * 8));
            __s[(int)uVar16] = uVar16;
          }
        }
        uVar25 = (ulong)uVar2;
        if ((int)uVar17 < (int)uVar2) {
          uVar25 = uVar31;
        }
        iVar30 = (int)uVar25;
        N_VDotProdMulti(uVar25,uVar13,lVar19,lVar12);
        *puVar9 = 0x3ff0000000000000;
        *puVar10 = uVar4;
        if (iVar30 < 1) {
          if (iVar15 == 0) {
            uVar31 = 1;
          }
          else {
            puVar9[1] = -(1.0 - dVar34);
            puVar10[1] = uVar13;
            uVar31 = 2;
          }
        }
        else {
          lVar19 = (long)(int)uVar17;
          uVar31 = (ulong)(iVar30 + 1);
          pdVar26 = (double *)((long)pdVar11 + (lVar19 * 8 + 8) * uVar25 + -8);
          uVar28 = 1;
          lVar22 = 0;
          uVar41 = (ulong)DAT_00103020;
          uVar24 = uVar25;
          do {
            dVar38 = *(double *)(lVar12 + -8 + uVar24 * 8);
            uVar21 = uVar24 - 1;
            lVar29 = lVar22;
            pdVar32 = pdVar26;
            if ((long)uVar24 < (long)uVar25) {
              do {
                dVar38 = dVar38 - *pdVar32 * *(double *)(uVar25 * 8 + lVar12 + lVar29 * 8);
                *(double *)(lVar12 + uVar21 * 8) = dVar38;
                lVar29 = lVar29 + 1;
                pdVar32 = pdVar32 + lVar19;
              } while ((int)lVar29 != 0);
            }
            dVar33 = 0.0;
            if ((dVar38 != 0.0) || (NAN(dVar38))) {
              dVar33 = dVar38 / pdVar11[(int)((uVar17 + 1) * (int)uVar21)];
            }
            *(double *)(lVar12 + uVar21 * 8) = dVar33;
            puVar9[uVar28] = (ulong)dVar33 ^ uVar41;
            puVar10[uVar28] = *(undefined8 *)(lVar8 + (long)(int)__s[uVar21] * 8);
            uVar28 = uVar28 + 1;
            lVar22 = lVar22 + -1;
            pdVar26 = (double *)((long)pdVar26 + (lVar19 * 8 ^ 0xfffffffffffffff8U));
            uVar24 = uVar21;
          } while (uVar28 != uVar31);
          if (iVar15 != 0) {
            dVar34 = 1.0 - dVar34;
            puVar9[uVar31] = (ulong)dVar34 ^ uVar41;
            puVar10[uVar31] = uVar13;
            uVar24 = 0xffffffffffffffff;
            uVar25 = (ulong)(iVar30 - 1);
            do {
              puVar9[uVar31 + uVar24 + 2] = *(double *)(lVar12 + uVar25 * 8) * dVar34;
              puVar10[uVar31 + uVar24 + 2] = *(undefined8 *)(lVar23 + (long)(int)__s[uVar25] * 8);
              uVar25 = uVar25 - 1;
              uVar24 = uVar24 + 1;
            } while (iVar30 - 1 != uVar24);
            if ((int)uVar2 < lVar19) {
              uVar17 = uVar2;
            }
            uVar31 = (ulong)(uVar17 + (int)uVar24 + 3);
          }
        }
        N_VLinearCombination(uVar31,puVar9,puVar10,ycor);
      }
LAB_00101d52:
      plVar1 = (long *)((long)NLS->content + 0x98);
      *plVar1 = *plVar1 + 1;
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,ycor,uVar3,uVar5);
      iVar15 = (**(code **)((long)NLS->content + 8))
                         (tol,NLS,ycor,uVar5,w,*(undefined8 *)((long)NLS->content + 0xa8));
      if (iVar15 != 0x385) {
        if (iVar15 == 0) {
          return 0;
        }
        plVar1 = (long *)((long)NLS->content + 0xa0);
        *plVar1 = *plVar1 + 1;
        return iVar15;
      }
      pvVar20 = NLS->content;
      iVar15 = *(int *)((long)pvVar20 + 0x90) + 1;
      *(int *)((long)pvVar20 + 0x90) = iVar15;
    } while (iVar15 < *(int *)((long)pvVar20 + 0x94));
    lVar23 = *(long *)((long)pvVar20 + 0xa0) + 1;
  }
  *(long *)((long)pvVar20 + 0xa0) = lVar23;
  return 0x386;
}

Assistant:

int SUNNonlinSolSolve_FixedPoint(SUNNonlinearSolver NLS,
                                 SUNDIALS_MAYBE_UNUSED N_Vector y0,
                                 N_Vector ycor, N_Vector w, sunrealtype tol,
                                 SUNDIALS_MAYBE_UNUSED sunbooleantype callSetup,
                                 void* mem)
{
  SUNFunctionBegin(NLS->sunctx);
  /* local variables */
  int retval;
  N_Vector yprev, gy, delta;

  /* check that all required function pointers have been set */
  SUNAssert(FP_CONTENT(NLS)->Sys && FP_CONTENT(NLS)->CTest, SUN_ERR_ARG_CORRUPT);

  /* set local shortcut variables */
  yprev = FP_CONTENT(NLS)->yprev;
  gy    = FP_CONTENT(NLS)->gy;
  delta = FP_CONTENT(NLS)->delta;

  /* initialize iteration and convergence fail counters for this solve */
  FP_CONTENT(NLS)->niters     = 0;
  FP_CONTENT(NLS)->nconvfails = 0;

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
                     "SUNNonlinSolSolve_FixedPoint", "begin-iteration",
                     "iter = %ld, nni = %ld", (long int)0,
                     FP_CONTENT(NLS)->niters);
#endif

  /* Looping point for attempts at solution of the nonlinear system:
       Evaluate fixed-point function (store in gy).
       Performs the accelerated fixed-point iteration.
       Performs stopping tests. */
  for (FP_CONTENT(NLS)->curiter = 0;
       FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters;
       FP_CONTENT(NLS)->curiter++)
  {
    /* update previous solution guess */
    N_VScale(ONE, ycor, yprev);
    SUNCheckLastErr();

    /* Compute fixed-point iteration function, store in gy.
       We do not use SUNCheck macros here because Sys is an integrator-provided
       callback and returns integrator specific error values  where 0 == success,
       < 0 is a failure, > 0 is recoverable error. */
    retval = FP_CONTENT(NLS)->Sys(ycor, gy, mem);
    if (retval != 0) { return retval; }

    /* perform fixed point update, based on choice of acceleration or not */
    if (FP_CONTENT(NLS)->m == 0)
    { /* basic fixed-point solver */
      N_VScale(ONE, gy, ycor);
      SUNCheckLastErr();
    }
    else
    { /* Anderson-accelerated solver */
      SUNCheckCall(
        AndersonAccelerate(NLS, gy, ycor, yprev, FP_CONTENT(NLS)->curiter));
    }

    /* increment nonlinear solver iteration counter */
    FP_CONTENT(NLS)->niters++;

    /* compute change in solution, and call the convergence test function */
    N_VLinearSum(ONE, ycor, -ONE, yprev, delta);
    SUNCheckLastErr();

    /* test for convergence */
    retval = FP_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                    FP_CONTENT(NLS)->ctest_data);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
                       "SUNNonlinSolSolve_FixedPoint", "end-of-iterate",
                       "iter = %ld, nni = %ld, wrmsnorm = %.16g",
                       (long int)FP_CONTENT(NLS)->curiter,
                       FP_CONTENT(NLS)->niters, N_VWrmsNorm(delta, w));
#endif

    /* return if successful */
    if (retval == 0) { return SUN_SUCCESS; }

    /* check if the iterations should continue; otherwise increment the
       convergence failure count and return error flag */
    if (retval != SUN_NLS_CONTINUE)
    {
      FP_CONTENT(NLS)->nconvfails++;
      return (retval);
    }
  }

  /* if we've reached this point, then we exhausted the iteration limit;
     increment the convergence failure count and return */
  FP_CONTENT(NLS)->nconvfails++;
  return SUN_NLS_CONV_RECVR;
}